

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

void mon_catchup_elapsed_time(monst *mtmp,long nmv)

{
  char cVar1;
  int iVar2;
  edog *edog;
  int wilder;
  int imv;
  long nmv_local;
  monst *mtmp_local;
  
  if (nmv < 0x7fff) {
    edog._4_4_ = (int)nmv;
  }
  else {
    edog._4_4_ = 0x7ffe;
  }
  cVar1 = (char)edog._4_4_;
  if (mtmp->mblinded != '\0') {
    if (edog._4_4_ < (int)(uint)mtmp->mblinded) {
      mtmp->mblinded = mtmp->mblinded - cVar1;
    }
    else {
      mtmp->mblinded = '\x01';
    }
  }
  if (mtmp->mfrozen != '\0') {
    if (edog._4_4_ < (int)(uint)mtmp->mfrozen) {
      mtmp->mfrozen = mtmp->mfrozen - cVar1;
    }
    else {
      mtmp->mfrozen = '\x01';
    }
  }
  if (mtmp->mfleetim != '\0') {
    if (edog._4_4_ < (int)(uint)mtmp->mfleetim) {
      mtmp->mfleetim = mtmp->mfleetim - cVar1;
    }
    else {
      mtmp->mfleetim = '\x01';
    }
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) != 0) && (iVar2 = rn2(edog._4_4_ + 1), 0x14 < iVar2)
     ) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xff7fffff;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) && (iVar2 = rn2(edog._4_4_ + 1), 0x19 < iVar2)
     ) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffdfffff;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x14 & 1) != 0) && (iVar2 = rn2(edog._4_4_ + 1), 5 < iVar2)) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffefffff;
  }
  if (mtmp->meating < edog._4_4_) {
    mtmp->meating = 0;
  }
  else {
    mtmp->meating = mtmp->meating - edog._4_4_;
  }
  if (mtmp->mspec_used < edog._4_4_) {
    mtmp->mspec_used = 0;
  }
  else {
    mtmp->mspec_used = mtmp->mspec_used - edog._4_4_;
  }
  if (mtmp->mtame != '\0') {
    iVar2 = (edog._4_4_ + 0x4b) / 0x96;
    if (iVar2 < mtmp->mtame) {
      mtmp->mtame = mtmp->mtame - (char)iVar2;
    }
    else {
      cVar1 = mtmp->mtame;
      iVar2 = rn2(iVar2);
      if (iVar2 < cVar1) {
        mtmp->mtame = '\0';
      }
      else {
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
        mtmp->mtame = '\0';
      }
    }
  }
  if ((((mtmp->mtame != '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0)) &&
      (((mtmp->data->mflags1 & 0x20000000) != 0 || ((mtmp->data->mflags1 & 0x40000000) != 0)))) &&
     (((*(int *)((long)&mtmp[1].data + 4) + 500U < moves && (mtmp->mhp < 3)) ||
      (*(int *)((long)&mtmp[1].data + 4) + 0x2eeU < moves)))) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
    mtmp->mtame = '\0';
  }
  if ((mtmp->mtame == '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) != 0)) {
    impossible("catching up for leashed monster?");
    m_unleash(mtmp,'\0');
  }
  if ((mtmp->data->mflags1 & 0x800000) == 0) {
    edog._4_4_ = edog._4_4_ / 0x14;
  }
  if (mtmp->mhp + edog._4_4_ < mtmp->mhpmax) {
    mtmp->mhp = edog._4_4_ + mtmp->mhp;
  }
  else {
    mtmp->mhp = mtmp->mhpmax;
  }
  return;
}

Assistant:

void mon_catchup_elapsed_time(struct monst *mtmp, long nmv)
{
	int imv = 0;	/* avoid zillions of casts and lint warnings */

	if (nmv >= LARGEST_INT)		/* paranoia */
	    imv = LARGEST_INT - 1;
	else
	    imv = (int)nmv;

	/* might stop being afraid, blind or frozen */
	/* set to 1 and allow final decrement in movemon() */
	if (mtmp->mblinded) {
	    if (imv >= (int) mtmp->mblinded) mtmp->mblinded = 1;
	    else mtmp->mblinded -= imv;
	}
	if (mtmp->mfrozen) {
	    if (imv >= (int) mtmp->mfrozen) mtmp->mfrozen = 1;
	    else mtmp->mfrozen -= imv;
	}
	if (mtmp->mfleetim) {
	    if (imv >= (int) mtmp->mfleetim) mtmp->mfleetim = 1;
	    else mtmp->mfleetim -= imv;
	}

	/* might recover from temporary trouble */
	if (mtmp->mtrapped && rn2(imv + 1) > 40/2) mtmp->mtrapped = 0;
	if (mtmp->mconf    && rn2(imv + 1) > 50/2) mtmp->mconf = 0;
	if (mtmp->mstun    && rn2(imv + 1) > 10/2) mtmp->mstun = 0;

	/* might finish eating or be able to use special ability again */
	if (imv > mtmp->meating) mtmp->meating = 0;
	else mtmp->meating -= imv;
	if (imv > mtmp->mspec_used) mtmp->mspec_used = 0;
	else mtmp->mspec_used -= imv;

	/* reduce tameness for every 150 moves you are separated */
	if (mtmp->mtame) {
	    int wilder = (imv + 75) / 150;
	    if (mtmp->mtame > wilder) mtmp->mtame -= wilder;	/* less tame */
	    else if (mtmp->mtame > rn2(wilder)) mtmp->mtame = 0;  /* untame */
	    else mtmp->mtame = mtmp->mpeaceful = 0;		/* hostile! */
	}
	/* check to see if it would have died as a pet; if so, go wild instead
	 * of dying the next time we call dog_move()
	 */
	if (mtmp->mtame && !mtmp->isminion &&
			(carnivorous(mtmp->data) || herbivorous(mtmp->data))) {
	    struct edog *edog = EDOG(mtmp);

	    if ((moves > edog->hungrytime + 500 && mtmp->mhp < 3) ||
		    (moves > edog->hungrytime + 750))
		mtmp->mtame = mtmp->mpeaceful = 0;
	}

	if (!mtmp->mtame && mtmp->mleashed) {
	    /* leashed monsters should always be with hero, consequently
	       never losing any time to be accounted for later */
	    impossible("catching up for leashed monster?");
	    m_unleash(mtmp, FALSE);
	}

	/* recover lost hit points */
	if (!regenerates(mtmp->data)) imv /= 20;
	if (mtmp->mhp + imv >= mtmp->mhpmax)
	    mtmp->mhp = mtmp->mhpmax;
	else mtmp->mhp += imv;
}